

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O2

void nsync::nsync_mu_unlock_without_wakeup(nsync_mu *mu)

{
  uint uVar1;
  bool bVar2;
  
  LOCK();
  bVar2 = (mu->word).super___atomic_base<unsigned_int>._M_i == 1;
  if (bVar2) {
    (mu->word).super___atomic_base<unsigned_int>._M_i = 0;
  }
  UNLOCK();
  if (bVar2) {
    return;
  }
  uVar1 = (mu->word).super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 - 1 & 0xffffff01) != 0) {
    if (uVar1 < 0x100) {
      nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu not held in write mode\n");
      return;
    }
    nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu held in read mode\n");
    return;
  }
  if ((uVar1 & 0x8c) != 4) {
    LOCK();
    bVar2 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
    if (bVar2) {
      (mu->word).super___atomic_base<unsigned_int>._M_i = uVar1 - 1;
    }
    UNLOCK();
    if (bVar2) {
      return;
    }
  }
  nsync_mu_unlock_slow_(mu,(lock_type *)nsync_writer_type_);
  return;
}

Assistant:

void nsync_mu_unlock_without_wakeup (nsync_mu *mu) {
	RWLOCK_RELEASE (mu, 1);
	IGNORE_RACES_START ();
	/* See comment in nsync_mu_unlock(). */
	if (!ATM_CAS_REL (&mu->word, MU_WLOCK, 0)) {
		uint32_t old_word = ATM_LOAD (&mu->word);
		uint32_t new_word = old_word - MU_WLOCK;
		if ((new_word & (MU_RLOCK_FIELD | MU_WLOCK)) != 0) {
			if ((old_word & MU_RLOCK_FIELD) != 0) {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
					      "held in read mode\n");
			} else {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
					      "not held in write mode\n");
			}
		} else if ((old_word & (MU_WAITING | MU_DESIG_WAKER | MU_ALL_FALSE)) ==
			   MU_WAITING || !ATM_CAS_REL (&mu->word, old_word, new_word)) {
			nsync_mu_unlock_slow_ (mu, nsync_writer_type_);
		}
	}
	IGNORE_RACES_END ();
}